

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

bool __thiscall
Ptex::v2_4::PtexReader::readZipBlock(PtexReader *this,void *data,int zipsize,int unzipsize)

{
  uLong uVar1;
  bool bVar2;
  int iVar3;
  uInt size;
  int iVar4;
  Bytef aBStack_4048 [16376];
  undefined8 uStack_50;
  int local_3c;
  z_stream_s *local_38;
  
  if (-1 < (unzipsize | zipsize)) {
    local_38 = &this->_zstream;
    if ((this->_zstream).state == (internal_state *)0x0) {
      uStack_50 = 0x108c79;
      inflateInit_(local_38,"1.2.11",0x70);
    }
    (this->_zstream).next_out = (Bytef *)data;
    (this->_zstream).avail_out = unzipsize;
    local_3c = unzipsize;
    do {
      size = 0x4000;
      if (zipsize < 0x4000) {
        size = zipsize;
      }
      zipsize = zipsize - size;
      bVar2 = readBlock(this,aBStack_4048,size,true);
      iVar4 = 3;
      if (bVar2) {
        (this->_zstream).next_in = aBStack_4048;
        (this->_zstream).avail_in = size;
        iVar3 = inflate(local_38,(ulong)(zipsize == 0) << 2);
        if (iVar3 == 0) {
          iVar4 = 0;
        }
        else if (iVar3 != 1) {
          setError(this,"PtexReader error: unzip failed, file corrupt");
          inflateReset(local_38);
          iVar4 = 1;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 == 3) {
      uVar1 = (this->_zstream).total_out;
      inflateReset(local_38);
      bVar2 = (int)uVar1 == local_3c;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool PtexReader::readZipBlock(void* data, int zipsize, int unzipsize)
{
    if (zipsize < 0 || unzipsize < 0) return false;
    if (!_zstream.state) {
        inflateInit(&_zstream);
    }

    void* buff = alloca(BlockSize);
    _zstream.next_out = (Bytef*) data;
    _zstream.avail_out = unzipsize;

    while (1) {
        int size = (zipsize < BlockSize) ? zipsize : BlockSize;
        zipsize -= size;
        if (!readBlock(buff, size)) break;
        _zstream.next_in = (Bytef*) buff;
        _zstream.avail_in = size;
        int zresult = inflate(&_zstream, zipsize ? Z_NO_FLUSH : Z_FINISH);
        if (zresult == Z_STREAM_END) break;
        if (zresult != Z_OK) {
            setError("PtexReader error: unzip failed, file corrupt");
            inflateReset(&_zstream);
            return 0;
        }
    }

    int total = (int)_zstream.total_out;
    inflateReset(&_zstream);
    return total == unzipsize;
}